

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errhandl.c
# Opt level: O0

void WriteLASErrDescr(FILE *File)

{
  char cVar1;
  int NoPrintedObj;
  FILE *File_local;
  
  if (LASErrId != LASOK) {
    if (LASProcName != (char *)0x0) {
      fprintf((FILE *)File,"in %s",LASProcName);
      if (((LASObject1Name != (char *)0x0) || (LASObject2Name != (char *)0x0)) ||
         (LASObject3Name != (char *)0x0)) {
        fprintf((FILE *)File," for ");
      }
      cVar1 = LASObject1Name != (char *)0x0;
      if ((bool)cVar1) {
        fprintf((FILE *)File,"%s",LASObject1Name);
      }
      if (LASObject2Name != (char *)0x0) {
        if ((bool)cVar1) {
          fprintf((FILE *)File,", ");
        }
        fprintf((FILE *)File,"%s",LASObject2Name);
        cVar1 = cVar1 + '\x01';
      }
      if (LASObject3Name != (char *)0x0) {
        if (cVar1 != '\0') {
          fprintf((FILE *)File,", ");
        }
        fprintf((FILE *)File,"%s",LASObject3Name);
      }
      fprintf((FILE *)File,":");
    }
    fprintf((FILE *)File,"\n");
  }
  switch(LASErrId) {
  case LASOK:
    break;
  case LASMemAllocErr:
    fprintf((FILE *)File,"Not enough memory is available.\n");
    break;
  case LASLValErr:
    fprintf((FILE *)File,"L-value parameter is expected.\n");
    break;
  case LASDimErr:
    fprintf((FILE *)File,"Objects have incompatible dimensions.\n");
    break;
  case LASRangeErr:
    fprintf((FILE *)File,"Indices are out of range.\n");
    break;
  case LASSymStorErr:
    fprintf((FILE *)File,"Some elements are stored in lower triangular part");
    fprintf((FILE *)File," of a symmetric matrix.\n");
    break;
  case LASMatrCombErr:
    fprintf((FILE *)File,"Matrices can not be combined.\n");
    break;
  case LASMulInvErr:
    fprintf((FILE *)File,"Inverse multiplication can not be carried out.\n");
    break;
  case LASElNotSortedErr:
    fprintf((FILE *)File,"Matrix elements are not sorted.\n");
    break;
  case LASZeroInDiagErr:
    fprintf((FILE *)File,"Zero elements in matrix diagonal are not allowed.\n");
    break;
  case LASZeroPivotErr:
    fprintf((FILE *)File,"Factorization produces zero pivot elements.\n");
    break;
  case LASILUStructErr:
    fprintf((FILE *)File,"Matrix has structure which is not allowed for ILU factorization.\n");
    break;
  case LASBreakdownErr:
    fprintf((FILE *)File,"Iterative solver fails.\n");
    break;
  case LASUserBreak:
    fprintf((FILE *)File,"Termination by an user break.\n");
  }
  return;
}

Assistant:

void WriteLASErrDescr(FILE *File)
/* write a short description of the reason caused break of LASPack */
{
    int NoPrintedObj;
    
    if (LASErrId != LASOK) {
	if (LASProcName != NULL) {
            fprintf(File, "in %s", LASProcName);
	    NoPrintedObj = 0;
	    if (LASObject1Name != NULL || LASObject2Name != NULL
		|| LASObject3Name != NULL)
                fprintf(File, " for ");
	    if (LASObject1Name != NULL) {
	        if (NoPrintedObj > 0)
                    fprintf(File, ", ");
                fprintf(File, "%s", LASObject1Name);
		NoPrintedObj++;
	    }
	    if (LASObject2Name != NULL) {
	        if (NoPrintedObj > 0)
                    fprintf(File, ", ");
                fprintf(File, "%s", LASObject2Name);
		NoPrintedObj++;
	    }
	    if (LASObject3Name != NULL) {
	        if (NoPrintedObj > 0)
                    fprintf(File, ", ");
                fprintf(File, "%s", LASObject3Name);
		NoPrintedObj++;
	    }
            fprintf(File, ":");
        }
        fprintf(File, "\n");
    }
    
    switch (LASErrId) {
        case LASOK:
            break;
        case LASMemAllocErr:
	    fprintf(File, "Not enough memory is available.\n");
            break;
        case LASLValErr:
	    fprintf(File, "L-value parameter is expected.\n");
            break;
        case LASDimErr:
	    fprintf(File, "Objects have incompatible dimensions.\n");
            break;
        case LASRangeErr:
	    fprintf(File, "Indices are out of range.\n");
            break;
        case LASSymStorErr:
	    fprintf(File, "Some elements are stored in lower triangular part");
	    fprintf(File, " of a symmetric matrix.\n");
            break;
        case LASMatrCombErr:
	    fprintf(File, "Matrices can not be combined.\n");
            break;
        case LASMulInvErr:
	    fprintf(File, "Inverse multiplication can not be carried out.\n");
            break;
        case LASElNotSortedErr:
	    fprintf(File, "Matrix elements are not sorted.\n");
            break;
        case LASZeroInDiagErr:
	    fprintf(File, "Zero elements in matrix diagonal are not allowed.\n");
            break;
        case LASZeroPivotErr:
	    fprintf(File, "Factorization produces zero pivot elements.\n");
            break;
        case LASILUStructErr:
	    fprintf(File, "Matrix has structure which is not allowed for ILU factorization.\n");
            break;
        case LASBreakdownErr:
	    fprintf(File, "Iterative solver fails.\n");
            break;
        case LASUserBreak:
	    fprintf(File, "Termination by an user break.\n");
            break;
    }
}